

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void genlink(global_State *g,GCObject *o)

{
  byte bVar1;
  byte bVar2;
  GCObject **ppGVar3;
  
  bVar1 = o->marked;
  bVar2 = bVar1 & 7;
  if (bVar2 == 6) {
    bVar2 = 0xfc;
  }
  else {
    if (bVar2 != 5) {
      return;
    }
    ppGVar3 = getgclist(o);
    *ppGVar3 = g->grayagain;
    g->grayagain = o;
    bVar2 = 199;
  }
  o->marked = bVar1 & bVar2;
  return;
}

Assistant:

static void genlink (global_State *g, GCObject *o) {
  lua_assert(isblack(o));
  if (getage(o) == G_TOUCHED1) {  /* touched in this cycle? */
    linkobjgclist(o, g->grayagain);  /* link it back in 'grayagain' */
  }  /* everything else do not need to be linked back */
  else if (getage(o) == G_TOUCHED2)
    changeage(o, G_TOUCHED2, G_OLD);  /* advance age */
}